

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *
pbrt::
returnArray<pbrt::Point3<float>,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,pbrt::Point3<float>(*)(float_const*,pbrt::FileLoc_const*)>
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *values,ParsedParameter *param,
          int nPerItem,_func_Point3<float>_float_ptr_FileLoc_ptr *convert)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  size_t sVar4;
  const_reference pvVar5;
  reference pvVar6;
  int in_ECX;
  long in_RDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  code *in_R8;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [12];
  size_t i;
  size_t n;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *v;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar8;
  undefined4 uStack_58;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *local_50;
  
  args_1 = in_RDI;
  bVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::empty
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x7ecc68);
  if (bVar3) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_ffffffffffffff90,(char *)args_1,in_RDI);
  }
  sVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
  if (sVar4 % (ulong)(long)in_ECX == 0) {
    *(undefined1 *)(in_RDX + 0xd8) = 1;
    sVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
    this = (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
           (sVar4 / (ulong)(long)in_ECX);
    std::allocator<pbrt::Point3<float>_>::allocator((allocator<pbrt::Point3<float>_> *)0x7ecd36);
    std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
              (this,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::allocator<pbrt::Point3<float>_>::~allocator((allocator<pbrt::Point3<float>_> *)0x7ecd59);
    for (local_50 = (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)0x0;
        local_50 <
        (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
        (sVar4 / (ulong)(long)in_ECX);
        local_50 = (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                   ((long)&(local_50->
                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1)) {
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (in_RSI,(long)in_ECX * (long)local_50);
      auVar7 = (*in_R8)(pvVar5,in_RDX + 0x40);
      auVar2._8_8_ = extraout_XMM0_Qb;
      auVar2._0_8_ = auVar7._0_8_;
      uVar1 = vmovlpd_avx(auVar2);
      uVar8 = (undefined4)uVar1;
      uStack_58 = (undefined4)((ulong)uVar1 >> 0x20);
      pvVar6 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                         ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                          in_RDI,(size_type)local_50);
      (pvVar6->super_Tuple3<pbrt::Point3,_float>).x = (float)uVar8;
      (pvVar6->super_Tuple3<pbrt::Point3,_float>).y = (float)uStack_58;
      (pvVar6->super_Tuple3<pbrt::Point3,_float>).z = auVar7._8_4_;
    }
    return (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)args_1;
  }
  ErrorExit<std::__cxx11::string_const&,int&>
            ((FileLoc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90,(int *)args_1);
}

Assistant:

static std::vector<ReturnType> returnArray(const ValuesType &values,
                                           const ParsedParameter &param, int nPerItem,
                                           C convert) {
    if (values.empty())
        ErrorExit(&param.loc, "No values provided for \"%s\".", param.name);
    if (values.size() % nPerItem)
        ErrorExit(&param.loc, "Number of values provided for \"%s\" not a multiple of %d",
                  param.name, nPerItem);

    param.lookedUp = true;
    size_t n = values.size() / nPerItem;
    std::vector<ReturnType> v(n);
    for (size_t i = 0; i < n; ++i)
        v[i] = convert(&values[nPerItem * i], &param.loc);
    return v;
}